

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O0

int __thiscall LibGens::Ym2612::reInit(Ym2612 *this,int clock,int rate)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  int local_64;
  int i_5;
  double j;
  double x_2;
  int local_48;
  int j_1;
  int i_4;
  int i_3;
  double x_1;
  int i_2;
  int i_1;
  double x;
  int i;
  int rate_local;
  int clock_local;
  Ym2612 *this_local;
  
  if (rate < 1) {
    __assert_fail("rate > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/chips/gens/Ym2612.cpp"
                  ,0x605,"int LibGens::Ym2612::reInit(int, int)");
  }
  if (rate < clock) {
    if ((rate < 1) || (clock <= rate)) {
      this_local._4_4_ = -1;
    }
    else {
      memset(&this->d->state,0,0x11b8);
      (this->d->state).Clock = clock;
      (this->d->state).Rate = rate;
      (this->d->state).Frequence =
           ((double)(this->d->state).Clock / (double)(this->d->state).Rate) / 144.0;
      (this->d->state).TimerBase = (int)((this->d->state).Frequence * 4096.0);
      if (((this->m_improved & 1U) == 0) || ((this->d->state).Frequence <= 1.0)) {
        (this->d->state).Inter_Step = 0x4000;
        (this->d->state).Inter_Cnt = 0;
      }
      else {
        (this->d->state).Inter_Step = (uint)(long)((1.0 / (this->d->state).Frequence) * 16384.0);
        (this->d->state).Inter_Cnt = 0;
        (this->d->state).Rate = (int)((double)(this->d->state).Clock / 144.0);
        (this->d->state).Frequence = 1.0;
      }
      for (x._4_4_ = 0; x._4_4_ < 0x800; x._4_4_ = x._4_4_ + 1) {
        this->d->FINC_TAB[x._4_4_] =
             (uint)(long)((double)x._4_4_ * (this->d->state).Frequence * 4096.0 * 0.5);
      }
      for (x_1._4_4_ = 0; x_1._4_4_ < 4; x_1._4_4_ = x_1._4_4_ + 1) {
        this->d->AR_TAB[x_1._4_4_] = 0;
        this->d->DR_TAB[x_1._4_4_] = 0;
      }
      for (x_1._0_4_ = 0; (int)x_1._0_4_ < 0x3c; x_1._0_4_ = x_1._0_4_ + 1) {
        dVar3 = (this->d->state).Frequence * ((double)(x_1._0_4_ & 3) * 0.25 + 1.0) *
                (double)(1 << ((byte)(x_1._0_4_ >> 2) & 0x1f)) * 268435456.0;
        this->d->AR_TAB[(long)(int)x_1._0_4_ + 4] = (uint)(long)(dVar3 / 399128.0);
        this->d->DR_TAB[(int)(x_1._0_4_ + 4)] = (uint)(long)(dVar3 / 5514396.0);
      }
      for (j_1 = 0x40; j_1 < 0x60; j_1 = j_1 + 1) {
        this->d->AR_TAB[j_1] = this->d->AR_TAB[0x3f];
        this->d->DR_TAB[j_1] = this->d->DR_TAB[0x3f];
      }
      for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
        for (x_2._4_4_ = 0; x_2._4_4_ < 0x20; x_2._4_4_ = x_2._4_4_ + 1) {
          dVar3 = (double)(byte)Ym2612Private::DT_DEF_TAB[(long)x_2._4_4_ + (long)local_48 * 0x20] *
                  (this->d->state).Frequence * 32.0;
          this->d->DT_TAB[local_48][x_2._4_4_] = (int)dVar3;
          this->d->DT_TAB[local_48 + 4][x_2._4_4_] = (int)-dVar3;
        }
      }
      iVar1 = (this->d->state).Rate;
      uVar2 = (this->d->state).Inter_Step;
      for (local_64 = 0; local_64 < 8; local_64 = local_64 + 1) {
        this->d->LFO_INC_TAB[local_64] =
             (uint)(long)((reInit::LFO_BITS[local_64] * 268435456.0) /
                         (double)(iVar1 * uVar2 >> 0xe));
      }
      reset(this);
      this_local._4_4_ = 0;
    }
    return this_local._4_4_;
  }
  __assert_fail("clock > rate",
                "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/chips/gens/Ym2612.cpp"
                ,0x606,"int LibGens::Ym2612::reInit(int, int)");
}

Assistant:

int Ym2612::reInit(int clock, int rate)
{
	assert(rate > 0);
	assert(clock > rate);
	if (rate <= 0 || clock <= rate)
		return -1;

	// Clear the state struct.
	memset(&d->state, 0, sizeof(d->state));
	d->state.Clock = clock;
	d->state.Rate = rate;

	// 144 = 12 * (prescale * 2) = 12 * 6 * 2
	// prescale set to 6 by default

	d->state.Frequence = ((double)(d->state.Clock) / (double)(d->state.Rate)) / 144.0;
	d->state.TimerBase = (int)(d->state.Frequence * 4096.0);

	if (m_improved && (d->state.Frequence > 1.0)) {
		d->state.Inter_Step = (unsigned int)((1.0 / d->state.Frequence) * (double)(0x4000));
		d->state.Inter_Cnt = 0;

		// We recalculate rate and frequence after interpolation
		d->state.Rate = (int)(d->state.Clock / 144.0);
		d->state.Frequence = 1.0;
	} else {
		// No interpolation.
		d->state.Inter_Step = 0x4000;
		d->state.Inter_Cnt = 0;
	}

//	LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG2,
//		"YM2612 frequency = %g, rate = %d, interp step = %.8X",
//		d->state.Frequence, d->state.Rate, d->state.Inter_Step);

	// Frequency Step table.
	for (int i = 0; i < 2048; i++) {
		double x = (double)(i) * d->state.Frequence;
		#if ((SIN_LBITS + SIN_HBITS - (21 - 7)) < 0)
			x /= (double) (1 << ((21 - 7) - SIN_LBITS - SIN_HBITS));
		#else
			x *= (double) (1 << (SIN_LBITS + SIN_HBITS - (21 - 7)));
		#endif
		x /= 2.0;			// because MUL = value * 2
		d->FINC_TAB[i] = (unsigned int)x;
	}

	// Attack and Decay Rate tables.
	// Entries 0-3 are always 0.
	for (int i = 0; i < 4; i++) {
		d->AR_TAB[i] = 0;
		d->DR_TAB[i] = 0;
	}

	// Attack and Decay Rate tables.
	// Calculate entries 32-63.
	for (int i = 0; i < 60; i++) {
		double x = d->state.Frequence;

		x *= 1.0 + ((i & 3) * 0.25);		 // bits 0-1 : x1.00, x1.25, x1.50, x1.75
		x *= (double) (1 << ((i >> 2)));	 // bits 2-5 : shift bits (x2^0 - x2^15)
		x *= (double) (d->ENV_LENGTH << ENV_LBITS); // on ajuste pour le tableau ENV_TAB

		d->AR_TAB[i + 4] = (unsigned int) (x / d->AR_RATE);
		d->DR_TAB[i + 4] = (unsigned int) (x / d->DR_RATE);
	}

	// Attack and Decay Rate tables.
	// Entries 64-95 are copies of entry 63.
	for (int i = 64; i < 96; i++) {
		d->AR_TAB[i] = d->AR_TAB[63];
		d->DR_TAB[i] = d->DR_TAB[63];
	}

	// Detune table.
	for (int i = 0; i < 4; i++) {
		for (int j = 0; j < 32; j++) {
			double x;
			#if ((SIN_LBITS + SIN_HBITS - 21) < 0)
				x = (double)d->DT_DEF_TAB[i][j] * d->state.Frequence /
				    (double)(1 << (21 - SIN_LBITS - SIN_HBITS));
			#else
				x = (double)d->DT_DEF_TAB[i][j] * d->state.Frequence *
				    (double)(1 << (SIN_LBITS + SIN_HBITS - 21));
			#endif

			d->DT_TAB[i + 0][j] = (int) x;
			d->DT_TAB[i + 4][j] = (int) -x;
		}
	}

	// LFO step table.
	// TODO: Move to a static class variable?
	static const double LFO_BITS[8] = {
		3.98, 5.56, 6.02, 6.37, 6.88, 9.63, 48.1, 72.2
	};

	double j = (d->state.Rate * d->state.Inter_Step) / 0x4000;
	for (int i = 0; i < 8; i++) {
		d->LFO_INC_TAB[i] = (unsigned int) (LFO_BITS[i] * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
	}


	// Reset the YM2612.
	reset();
	return 0;
}